

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

poptOption *
findOption(poptOption *opt,char *longName,size_t longNameLen,char shortName,
          poptCallbackType *callback,void **callbackData,uint argInfo)

{
  int iVar1;
  poptOption *ppVar2;
  char *pcVar3;
  uint uVar4;
  char shortName_00;
  int iVar5;
  poptOption *local_60;
  poptOption *local_48;
  poptOption *local_40;
  
  shortName_00 = shortName;
  if ((((longName != (char *)0x0) && (shortName == '\0')) && ((int)argInfo < 0)) &&
     (shortName_00 = '-', *longName != '\0')) {
    shortName_00 = shortName;
  }
  local_40 = (poptOption *)0x0;
  local_48 = (poptOption *)0x0;
  do {
    if (((opt->longName == (char *)0x0) && (opt->shortName == '\0')) && (opt->arg == (void *)0x0))
    goto LAB_00104aff;
    ppVar2 = (poptOption *)opt->arg;
    uVar4 = _poptArgMask & opt->argInfo;
    if (uVar4 == 4) {
      if (ppVar2 == poptHelpOptions) {
        ppVar2 = poptHelpOptionsI18N;
      }
      iVar5 = 4;
      if (((ppVar2 != (poptOption *)0x0) &&
          (ppVar2 = findOption(ppVar2,longName,longNameLen,shortName_00,callback,callbackData,
                               argInfo), ppVar2 != (poptOption *)0x0)) &&
         ((iVar5 = 1, local_60 = ppVar2, callback != (poptCallbackType *)0x0 &&
          (((callbackData != (void **)0x0 && (*callback != (poptCallbackType)0x0)) &&
           (*callbackData == (void *)0x0)))))) {
        *callbackData = opt->descrip;
      }
    }
    else if (uVar4 == 5) {
      iVar5 = 4;
      local_48 = ppVar2;
      local_40 = opt;
    }
    else {
      if ((opt->longName != (char *)0x0) &&
         ((-1 < (int)argInfo || (int)opt->argInfo < 0) && longName != (char *)0x0)) {
        iVar1 = longOptionStrcmp(opt,longName,longNameLen);
        iVar5 = 2;
        if (iVar1 != 0) goto LAB_00104ae5;
      }
      if ((shortName_00 == '\0') || (iVar5 = 2, shortName_00 != opt->shortName)) {
        iVar5 = 0;
      }
    }
LAB_00104ae5:
    if ((iVar5 != 0) && (iVar5 != 4)) {
      if (iVar5 == 2) {
LAB_00104aff:
        if ((opt->longName == (char *)0x0) && (opt->shortName == '\0')) {
          local_60 = (poptOption *)0x0;
        }
        else {
          if (callback != (poptCallbackType *)0x0) {
            if (local_40 == (poptOption *)0x0) {
              local_48 = (poptOption *)0x0;
            }
            *callback = (poptCallbackType)local_48;
          }
          local_60 = opt;
          if (callbackData != (void **)0x0) {
            if ((local_40 == (poptOption *)0x0) || ((local_40->argInfo & 0x20000000) != 0)) {
              pcVar3 = (char *)0x0;
            }
            else {
              pcVar3 = local_40->descrip;
            }
            *callbackData = pcVar3;
          }
        }
      }
      return local_60;
    }
    opt = opt + 1;
  } while( true );
}

Assistant:

static const struct poptOption *
findOption(const struct poptOption * opt,
		const char * longName, size_t longNameLen,
		char shortName,
		poptCallbackType * callback,
		const void ** callbackData,
		unsigned int argInfo)
{
    const struct poptOption * cb = NULL;
    poptArg cbarg = { .ptr = NULL };

    /* This happens when a single - is given */
    if (LF_ISSET(ONEDASH) && !shortName && (longName && *longName == '\0'))
	shortName = '-';

    for (; opt->longName || opt->shortName || opt->arg; opt++) {
	poptArg arg = { .ptr = opt->arg };

	switch (poptArgType(opt)) {
	case POPT_ARG_INCLUDE_TABLE:	/* Recurse on included sub-tables. */
	{   const struct poptOption * opt2;

	    poptSubstituteHelpI18N(arg.opt);	/* XXX side effects */
	    if (arg.ptr == NULL) continue;	/* XXX program error */
	    opt2 = findOption(arg.opt, longName, longNameLen, shortName, callback,
			      callbackData, argInfo);
	    if (opt2 == NULL) continue;
	    /* Sub-table data will be inherited if no data yet. */
	    if (callback && *callback
	     && callbackData && *callbackData == NULL)
		*callbackData = opt->descrip;
	    return opt2;
	}   break;
	case POPT_ARG_CALLBACK:
	    cb = opt;
	    cbarg.ptr = opt->arg;
	    continue;
	    break;
	default:
	    break;
	}

	if (longName != NULL && opt->longName != NULL &&
		   (!LF_ISSET(ONEDASH) || F_ISSET(opt, ONEDASH)) &&
		   longOptionStrcmp(opt, longName, longNameLen))
	{
	    break;
	} else if (shortName && shortName == opt->shortName) {
	    break;
	}
    }

    if (opt->longName == NULL && !opt->shortName)
	return NULL;

    if (callback)
	*callback = (cb ? cbarg.cb : NULL);
    if (callbackData)
	*callbackData = (cb && !CBF_ISSET(cb, INC_DATA) ? cb->descrip : NULL);

    return opt;
}